

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::write85
          (Fl_PostScript_Graphics_Driver *this,void *data,uchar *p,int len)

{
  int iVar1;
  uchar *puVar2;
  int local_3c;
  int c;
  uchar *last;
  struct85 *big;
  uchar *puStack_20;
  int len_local;
  uchar *p_local;
  void *data_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  puVar2 = p + len;
  puStack_20 = p;
  while (puStack_20 < puVar2) {
    local_3c = 4 - *(int *)((long)data + 4);
    if ((long)puVar2 - (long)puStack_20 < (long)local_3c) {
      local_3c = (int)puVar2 - (int)puStack_20;
    }
    memcpy((void *)((long)data + (long)*(int *)((long)data + 4)),puStack_20,(long)local_3c);
    puStack_20 = puStack_20 + local_3c;
    *(int *)((long)data + 4) = local_3c + *(int *)((long)data + 4);
    if (*(int *)((long)data + 4) == 4) {
      iVar1 = convert85((uchar *)data,(uchar *)((long)data + 0xc));
      fwrite((void *)((long)data + 0xc),(long)iVar1,1,(FILE *)this->output);
      *(undefined4 *)((long)data + 4) = 0;
      iVar1 = *(int *)((long)data + 8) + 1;
      *(int *)((long)data + 8) = iVar1;
      if (0xf < iVar1) {
        fputc(10,(FILE *)this->output);
        *(undefined4 *)((long)data + 8) = 0;
      }
    }
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::write85(void *data, const uchar *p, int len) // sends len input bytes for ASCII85 encoding
{
  struct85 *big = (struct85 *)data;
  const uchar *last = p + len;
  while (p < last) {
    int c = 4 - big->l4;
    if (last-p < c) c = last-p;
    memcpy(big->bytes4 + big->l4, p, c);
    p += c;
    big->l4 += c;
    if (big->l4 == 4) {
      c = convert85(big->bytes4, big->chars5);
      fwrite(big->chars5, c, 1, output);
      big->l4 = 0;
      if (++big->blocks >= 16) { fputc('\n', output); big->blocks = 0; }
    }
  }
}